

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::BasicWriter<char>::write<std::__cxx11::string,unsigned_long,std::__cxx11::string>
          (BasicWriter<char> *this,BasicCStringRef<char> arg0,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          unsigned_long *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  pointer local_38;
  size_type sStack_30;
  unsigned_long local_28;
  pointer local_18;
  size_type sStack_10;
  
  local_38 = (args->_M_dataplus)._M_p;
  sStack_30 = args->_M_string_length;
  local_28 = *args_1;
  local_18 = (args_2->_M_dataplus)._M_p;
  sStack_10 = args_2->_M_string_length;
  write(this,(int)arg0.data_,(void *)0xb5b,(size_t)&local_38);
  return;
}

Assistant:

BasicWriter &operator<<(int value)
    {
        write_decimal(value);
        return *this;
    }